

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

bool Minisat::updateOptions(void)

{
  char cVar1;
  long lVar2;
  size_t __ptr;
  int iVar3;
  char *pcVar4;
  undefined8 uStack_60;
  undefined8 uStack_58;
  byte local_49;
  undefined8 *local_48;
  int local_3c;
  long lStack_38;
  int count;
  unsigned_long __vla_expr0;
  size_t local_28;
  size_t len;
  char *original_args;
  char *args;
  
  uStack_60 = 0x12b454;
  pcVar4 = getenv("MINISAT_RUNTIME_ARGS");
  if (pcVar4 != (char *)0x0) {
    uStack_60 = 0x12b46f;
    pcVar4 = getenv("MINISAT_RUNTIME_ARGS");
    uStack_60 = 0x12b477;
    len = (size_t)strdup(pcVar4);
    if ((char *)len != (char *)0x0) {
      uStack_60 = 0x12b49c;
      original_args = (char *)len;
      local_28 = strlen((char *)len);
      lStack_38 = local_28 + 2;
      lVar2 = -(local_28 * 8 + 0x1f & 0xfffffffffffffff0);
      local_48 = (undefined8 *)((long)&uStack_58 + lVar2);
      local_3c = 1;
      __vla_expr0 = (unsigned_long)&uStack_58;
      *local_48 = "mergesat";
      while( true ) {
        cVar1 = *original_args;
        *(undefined8 *)((long)&uStack_60 + lVar2) = 0x12b4ec;
        iVar3 = isspace((int)cVar1);
        if (iVar3 == 0) break;
        original_args = original_args + 1;
      }
      for (; *original_args != '\0'; original_args = original_args + 1) {
        local_48[local_3c] = original_args;
        local_3c = local_3c + 1;
        while( true ) {
          local_49 = 0;
          if (*original_args != '\0') {
            cVar1 = *original_args;
            *(undefined8 *)((long)&uStack_60 + lVar2) = 0x12b53e;
            iVar3 = isspace((int)cVar1);
            local_49 = iVar3 != 0 ^ 0xff;
          }
          if ((local_49 & 1) == 0) break;
          original_args = original_args + 1;
        }
        if (*original_args == '\0') break;
        *original_args = '\0';
      }
      *(undefined8 *)((long)&uStack_60 + lVar2) = 0x12b58f;
      parseOptions(*(int **)((long)&len + lVar2),*(char ***)((long)&local_28 + lVar2),
                   *(bool *)((long)&__vla_expr0 + lVar2 + 7));
      __ptr = len;
      *(undefined8 *)((long)&uStack_60 + lVar2) = 0x12b598;
      free((void *)__ptr);
    }
  }
  return false;
}

Assistant:

bool MERGESAT_NSPACE::updateOptions()
{
    if (getenv("MINISAT_RUNTIME_ARGS") == NULL) return false;

    char *args = strdup(getenv("MINISAT_RUNTIME_ARGS")); // make sure it's freed
    if (!args) return false;
    char *original_args = args;

    const size_t len = strlen(args);

    char *argv[len + 2];
    int count = 1;

    argv[0] = "mergesat";
    while (isspace(*args)) ++args;
    while (*args) {
        argv[count++] = args;                    // store current argument
        while (*args && !isspace(*args)) ++args; // skip current token
        if (!*args) break;
        *args = (char)0; // separate current token
        ++args;
    }

    parseOptions(count, argv, false);
    free(original_args);
    return false;
}